

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint32_t helper_sel_flags_arm(uint32_t flags,uint32_t a,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = -(flags & 1) & 0xff;
  uVar2 = uVar1 + 0xff00;
  if ((flags & 2) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 + 0xff0000;
  if ((flags & 4) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 - 0x1000000;
  if ((flags & 8) == 0) {
    uVar2 = uVar1;
  }
  return uVar2 & (a ^ b) ^ b;
}

Assistant:

uint32_t HELPER(sel_flags)(uint32_t flags, uint32_t a, uint32_t b)
{
    uint32_t mask;

    mask = 0;
    if (flags & 1)
        mask |= 0xff;
    if (flags & 2)
        mask |= 0xff00;
    if (flags & 4)
        mask |= 0xff0000;
    if (flags & 8)
        mask |= 0xff000000;
    return (a & mask) | (b & ~mask);
}